

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::rangeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,int64_t min,int64_t max,bool useArrayFormat)

{
  ostream *poVar1;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  byte local_21;
  int64_t iStack_20;
  bool useArrayFormat_local;
  int64_t max_local;
  int64_t min_local;
  
  local_21 = (byte)max & 1;
  iStack_20 = min;
  max_local = (int64_t)this;
  min_local = (int64_t)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if ((local_21 & 1) == 0) {
    if (max_local == iStack_20) {
      std::ostream::operator<<(local_1a0,max_local);
    }
    else if (iStack_20 < 0) {
      poVar1 = (ostream *)std::ostream::operator<<(local_1a0,max_local);
      std::operator<<(poVar1,"...");
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<(local_1a0,max_local);
      poVar1 = std::operator<<(poVar1,"...");
      std::ostream::operator<<(poVar1,iStack_20);
    }
  }
  else {
    poVar1 = std::operator<<(local_1a0,"[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,max_local);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_20);
    std::operator<<(poVar1,"]");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string rangeToString(int64_t min, int64_t max, bool useArrayFormat = false) {
        std::stringstream ss;

        if (useArrayFormat) {
            ss << "[" << min << ", " << max << "]";
        } else {
            if (min == max) {
                ss << min;
            } else if (max < 0) {
                ss << min << "...";
            } else {
                ss << min << "..." << max;
            }
        }
        return ss.str();
    }